

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O1

AggregateFunctionSet * duckdb::MadFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  long lVar1;
  element_type *type;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  vector<duckdb::LogicalType,_true> MAD_TYPES;
  AggregateFunction result;
  allocator_type local_389;
  element_type *local_388;
  element_type *local_380;
  LogicalType local_370;
  string local_358;
  LogicalType local_338 [4];
  LogicalType local_2d8;
  LogicalType local_2c0;
  LogicalType local_2a8;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"mad","");
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)&local_388,DECIMAL);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_388;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_338,__l,
             &local_389);
  LogicalType::LogicalType(&local_370,DECIMAL);
  AggregateFunction::AggregateFunction
            (&local_290,(vector<duckdb::LogicalType,_true> *)local_338,&local_370,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindMedianAbsoluteDeviationDecimal,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_290);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0247e830;
  if (local_290.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_370);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_338);
  LogicalType::~LogicalType((LogicalType *)&local_388);
  LogicalType::LogicalType(local_338,FLOAT);
  LogicalType::LogicalType(local_338 + 1,DOUBLE);
  LogicalType::LogicalType(local_338 + 2,DATE);
  LogicalType::LogicalType(local_338 + 3,TIMESTAMP);
  LogicalType::LogicalType(&local_2d8,TIME);
  LogicalType::LogicalType(&local_2c0,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_2a8,TIME_TZ);
  __l_00._M_len = 7;
  __l_00._M_array = local_338;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_388,__l_00,
             (allocator_type *)&local_370);
  lVar1 = 0x90;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_338[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if (local_388 != local_380) {
    type = local_388;
    do {
      GetMedianAbsoluteDeviationAggregateFunctionInternal(&local_160,(LogicalType *)type);
      local_160.super_BaseScalarFunction.errors = CAN_THROW_RUNTIME_ERROR;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&this->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_160);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_0247e830;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      type = (element_type *)&(type->alias)._M_string_length;
    } while (type != local_380);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_388);
  return in_RDI;
}

Assistant:

AggregateFunctionSet MadFun::GetFunctions() {
	AggregateFunctionSet mad("mad");
	mad.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr,
	                                  nullptr, nullptr, nullptr, BindMedianAbsoluteDeviationDecimal));

	const vector<LogicalType> MAD_TYPES = {LogicalType::FLOAT,     LogicalType::DOUBLE, LogicalType::DATE,
	                                       LogicalType::TIMESTAMP, LogicalType::TIME,   LogicalType::TIMESTAMP_TZ,
	                                       LogicalType::TIME_TZ};
	for (const auto &type : MAD_TYPES) {
		mad.AddFunction(GetMedianAbsoluteDeviationAggregateFunction(type));
	}
	return mad;
}